

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O2

uint32_t event_track::find_sample_boundaries
                   (vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                    *emsgs_in,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *sample_boundaries,
                   uint64_t segment_start,uint64_t segment_end)

{
  pointer pDVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  uint uVar2;
  ulong uVar3;
  uint64_t pt;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = (pointer)segment_end;
  local_50 = (pointer)segment_start;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (sample_boundaries,&local_48);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (sample_boundaries,(value_type_conflict2 *)&local_50);
  if (segment_end != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (sample_boundaries,(value_type_conflict2 *)&local_60);
  }
  uVar2 = 0;
  do {
    uVar3 = (ulong)uVar2;
    pDVar1 = (emsgs_in->
             super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(emsgs_in->
                       super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0xd8) <= uVar3)
    {
      if (local_60 != (pointer)0x0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (sample_boundaries,(value_type_conflict2 *)&local_60);
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((sample_boundaries->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (sample_boundaries->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
      __first = std::
                __unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                          ((sample_boundaries->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start,
                           (sample_boundaries->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                (sample_boundaries,(const_iterator)__first._M_current,
                 (const_iterator)
                 (sample_boundaries->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
      if (local_60 == (pointer)0x0) {
        local_48._M_impl.super__Vector_impl_data._M_start =
             (pointer)((sample_boundaries->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_finish[-1] + 1);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (sample_boundaries,(unsigned_long *)&local_48);
      }
      return (uint32_t)
             ((ulong)((long)(sample_boundaries->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(sample_boundaries->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start) >> 3);
    }
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)pDVar1[uVar3].presentation_time_;
    local_58 = (pointer)((long)local_48._M_impl.super__Vector_impl_data._M_start +
                        (ulong)((ulong)pDVar1[uVar3].event_duration_ == 0) +
                        (ulong)pDVar1[uVar3].event_duration_);
    if (local_48._M_impl.super__Vector_impl_data._M_start < local_50) {
LAB_00104971:
      if (local_60 != (pointer)0x0) goto LAB_00104980;
LAB_0010499d:
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (sample_boundaries,(value_type_conflict2 *)&local_58);
    }
    else {
      if (local_48._M_impl.super__Vector_impl_data._M_start <= (pointer)((long)local_60 - 1U)) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (sample_boundaries,(value_type_conflict2 *)&local_48);
        goto LAB_00104971;
      }
LAB_00104980:
      if (((local_58 < local_60) && (local_50 <= local_58)) &&
         (std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (sample_boundaries,(value_type_conflict2 *)&local_58), local_60 == (pointer)0x0)
         ) goto LAB_0010499d;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

uint32_t event_track::find_sample_boundaries(
	const std::vector<DASHEventMessageBoxv1> &emsgs_in,
	std::vector<uint64_t> &sample_boundaries,
	uint64_t segment_start,
	uint64_t segment_end )
{

	sample_boundaries = std::vector<uint64_t>();
	sample_boundaries.push_back(segment_start);

	if (segment_end != 0)
		sample_boundaries.push_back(segment_end);

	for (uint32_t k = 0; k < emsgs_in.size(); k++)
	{
		uint64_t pt = emsgs_in[k].presentation_time_;
		uint64_t pt_du = emsgs_in[k].presentation_time_ + emsgs_in[k].event_duration_;

		if (emsgs_in[k].event_duration_ == 0)
			pt_du += 1;  // set the sample duration to a single tick

						 // boundaries due to events starting
		if (pt >= segment_start)  // event starts  
			if (segment_end == 0 || pt < segment_end)
				sample_boundaries.push_back(pt);

		// boundaries due to event ending
		if (segment_end != 0)
			if (pt_du >= segment_start && pt_du < segment_end)
				sample_boundaries.push_back(pt_du);

		if (segment_end == 0)
			sample_boundaries.push_back(pt_du);
	}

	if (segment_end != 0)
		sample_boundaries.push_back(segment_end);

	sort(sample_boundaries.begin(), sample_boundaries.end());
	sample_boundaries.erase(std::unique(sample_boundaries.begin(),
		sample_boundaries.end()), sample_boundaries.end());

	if (segment_end == 0)
		sample_boundaries.push_back(sample_boundaries[sample_boundaries.size() - 1] + 1);

	return (uint32_t)sample_boundaries.size();
}